

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::api::anon_unknown_1::
multithreadedCreatePerThreadDeviceTest<vkt::api::(anonymous_namespace)::QueryPool>
          (TestStatus *__return_storage_ptr__,anon_unknown_1 *this,Context *context,
          Parameters params)

{
  deUint32 maxResourceConsumers_;
  EnvClone *pEVar1;
  reference pvVar2;
  Resources *pRVar3;
  reference pvVar4;
  CreateThread<vkt::api::(anonymous_namespace)::QueryPool> *this_00;
  DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread> local_139;
  MovePtr<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
  local_138;
  SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources> local_128;
  SharedPtr<vkt::api::(anonymous_namespace)::EnvClone> local_118;
  uint local_104;
  undefined1 local_100 [4];
  deUint32 ndx;
  ThreadGroup threads;
  undefined1 local_c8 [8];
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>_>_>
  resources;
  allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_> local_99;
  undefined1 local_98 [8];
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
  perThreadEnv;
  Environment sharedEnv;
  Parameters deviceParams;
  deUint32 numThreads;
  Context *context_local;
  Context *local_20;
  Parameters params_local;
  
  params_local.queryType = params.queryType;
  local_20 = context;
  unique0x1000045f = __return_storage_ptr__;
  maxResourceConsumers_ = getDefaultTestThreadCount();
  register0x00000000 = getDefaulDeviceParameters((Context *)this);
  Environment::Environment
            ((Environment *)
             &perThreadEnv.
              super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(Context *)this,
             maxResourceConsumers_);
  std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>::allocator(&local_99);
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
  ::vector((vector<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
            *)local_98,(ulong)maxResourceConsumers_,&local_99);
  std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>::~allocator(&local_99);
  std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>_>::allocator
            ((allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>_> *)
             &threads.field_0x2f);
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>_>_>
  ::vector((vector<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>_>_>
            *)local_c8,(ulong)maxResourceConsumers_,(allocator_type *)&threads.field_0x2f);
  std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>_>::~allocator
            ((allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>_> *)
             &threads.field_0x2f);
  ThreadGroup::ThreadGroup((ThreadGroup *)local_100);
  for (local_104 = 0; local_104 < maxResourceConsumers_; local_104 = local_104 + 1) {
    pEVar1 = (EnvClone *)operator_new(0x6c0);
    EnvClone::EnvClone(pEVar1,(Environment *)
                              &perThreadEnv.
                               super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (Parameters *)&sharedEnv.field_0x34,1);
    de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>::SharedPtr(&local_118,pEVar1);
    pvVar2 = std::
             vector<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
             ::operator[]((vector<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
                           *)local_98,(ulong)local_104);
    de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>::operator=(pvVar2,&local_118);
    de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>::~SharedPtr(&local_118);
    pRVar3 = (Resources *)operator_new(1);
    pvVar2 = std::
             vector<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
             ::operator[]((vector<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
                           *)local_98,(ulong)local_104);
    pEVar1 = de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>::operator->(pvVar2);
    QueryPool::Resources::Resources(pRVar3,&pEVar1->env,(Parameters *)&local_20);
    de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>::SharedPtr
              (&local_128,pRVar3);
    pvVar4 = std::
             vector<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>_>_>
             ::operator[]((vector<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>_>_>
                           *)local_c8,(ulong)local_104);
    de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>::operator=
              (pvVar4,&local_128);
    de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>::~SharedPtr(&local_128);
    this_00 = (CreateThread<vkt::api::(anonymous_namespace)::QueryPool> *)operator_new(0x88);
    pvVar2 = std::
             vector<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
             ::operator[]((vector<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
                           *)local_98,(ulong)local_104);
    pEVar1 = de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>::operator->(pvVar2);
    pvVar4 = std::
             vector<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>_>_>
             ::operator[]((vector<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>_>_>
                           *)local_c8,(ulong)local_104);
    pRVar3 = de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>::operator*(pvVar4)
    ;
    CreateThread<vkt::api::(anonymous_namespace)::QueryPool>::CreateThread
              (this_00,&pEVar1->env,pRVar3,(Parameters *)&local_20);
    de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>::DefaultDeleter
              (&local_139);
    de::details::
    MovePtr<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
    ::MovePtr(&local_138,this_00);
    ThreadGroup::add((ThreadGroup *)local_100,&local_138);
    de::details::
    MovePtr<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
    ::~MovePtr(&local_138);
  }
  ThreadGroup::run(__return_storage_ptr__,(ThreadGroup *)local_100);
  ThreadGroup::~ThreadGroup((ThreadGroup *)local_100);
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>_>_>
  ::~vector((vector<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::QueryPool::Resources>_>_>
             *)local_c8);
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
  ::~vector((vector<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
             *)local_98);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus multithreadedCreatePerThreadDeviceTest (Context& context, typename Object::Parameters params)
{
	typedef SharedPtr<EnvClone>						EnvPtr;
	typedef SharedPtr<typename Object::Resources>	ResPtr;

	const deUint32				numThreads		= getDefaultTestThreadCount();
	const Device::Parameters	deviceParams	= getDefaulDeviceParameters(context);
	const Environment			sharedEnv		(context, numThreads);			// For creating Device's
	vector<EnvPtr>				perThreadEnv	(numThreads);
	vector<ResPtr>				resources		(numThreads);
	ThreadGroup					threads;

	for (deUint32 ndx = 0; ndx < numThreads; ndx++)
	{
		perThreadEnv[ndx]	= EnvPtr(new EnvClone(sharedEnv, deviceParams, 1u));
		resources[ndx]		= ResPtr(new typename Object::Resources(perThreadEnv[ndx]->env, params));

		threads.add(MovePtr<ThreadGroupThread>(new CreateThread<Object>(perThreadEnv[ndx]->env, *resources[ndx], params)));
	}

	return threads.run();
}